

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O0

void list_vulkan_instance_extensions(void)

{
  VkResult VVar1;
  VkExtensionProperties *__ptr;
  VkExtensionProperties *ep;
  uint32_t ep_count;
  uint32_t i;
  
  ep._0_4_ = 0;
  printf("Vulkan instance extensions:\n");
  VVar1 = (*glad_vkEnumerateInstanceExtensionProperties)
                    ((char *)0x0,(uint32_t *)&ep,(VkExtensionProperties *)0x0);
  if (VVar1 == VK_SUCCESS) {
    __ptr = (VkExtensionProperties *)calloc((ulong)(uint)ep,0x104);
    VVar1 = (*glad_vkEnumerateInstanceExtensionProperties)((char *)0x0,(uint32_t *)&ep,__ptr);
    if (VVar1 == VK_SUCCESS) {
      for (ep._4_4_ = 0; ep._4_4_ < (uint)ep; ep._4_4_ = ep._4_4_ + 1) {
        printf(" %s (v%u)\n",__ptr + ep._4_4_,(ulong)__ptr[ep._4_4_].specVersion);
      }
      free(__ptr);
    }
    else {
      free(__ptr);
    }
  }
  return;
}

Assistant:

static void list_vulkan_instance_extensions(void)
{
    uint32_t i, ep_count = 0;
    VkExtensionProperties* ep;

    printf("Vulkan instance extensions:\n");

    if (vkEnumerateInstanceExtensionProperties(NULL, &ep_count, NULL) != VK_SUCCESS)
        return;

    ep = calloc(ep_count, sizeof(VkExtensionProperties));

    if (vkEnumerateInstanceExtensionProperties(NULL, &ep_count, ep) != VK_SUCCESS)
    {
        free(ep);
        return;
    }

    for (i = 0;  i < ep_count;  i++)
        printf(" %s (v%u)\n", ep[i].extensionName, ep[i].specVersion);

    free(ep);
}